

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpack.c
# Opt level: O2

char * mpack_expect_ext_alloc(mpack_reader_t *reader,int8_t *type,size_t maxsize,size_t *size)

{
  uint32_t uVar1;
  char *pcVar2;
  
  *size = 0;
  if (0xfffffffe < maxsize) {
    maxsize = 0xffffffff;
  }
  uVar1 = mpack_expect_ext_max(reader,type,(uint32_t)maxsize);
  pcVar2 = mpack_read_bytes_alloc(reader,(ulong)uVar1);
  if (pcVar2 != (char *)0x0) {
    *size = (ulong)uVar1;
  }
  return pcVar2;
}

Assistant:

char* mpack_expect_ext_alloc(mpack_reader_t* reader, int8_t* type, size_t maxsize, size_t* size) {
    mpack_assert(size != NULL, "size cannot be NULL");
    *size = 0;

    if (maxsize > UINT32_MAX)
        maxsize = UINT32_MAX;

    size_t length = mpack_expect_ext_max(reader, type, (uint32_t)maxsize);
    char* data = mpack_read_bytes_alloc(reader, length);
    mpack_done_ext(reader);

    if (data)
        *size = length;
    return data;
}